

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleJitProfilingHelpers.cpp
# Opt level: O0

void Js::SimpleJitHelpers::ProfileReturnTypeCall
               (void *framePtr,ProfileId profileId,Var retval,JavascriptFunction *callee,
               CallInfo info)

{
  code *pcVar1;
  bool bVar2;
  CallFlags e;
  undefined4 *puVar3;
  JavascriptCallStackLayout *pJVar4;
  FunctionBody *this;
  DynamicProfileInfo *this_00;
  DynamicProfileInfo *dynamicProfileInfo;
  FunctionBody *functionBody;
  JavascriptFunction *caller;
  JavascriptFunction *callee_local;
  Var retval_local;
  ProfileId profileId_local;
  void *framePtr_local;
  CallInfo info_local;
  
  e = Js::operator&(info._3_4_ &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),
                    CallFlags_Value);
  bVar2 = operator!(e);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SimpleJitProfilingHelpers.cpp"
                                ,0x58,"(info.Flags & CallFlags_Value)",
                                "info.Flags & CallFlags_Value");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pJVar4 = JavascriptCallStackLayout::FromFramePointer(framePtr);
  this = JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)pJVar4);
  this_00 = FunctionBody::GetDynamicProfileInfo(this);
  DynamicProfileInfo::RecordReturnType(this_00,this,profileId,retval);
  return;
}

Assistant:

void SimpleJitHelpers::ProfileReturnTypeCall(void* framePtr, ProfileId profileId, Var retval, JavascriptFunction*callee, CallInfo info)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(SimpleProfileReturnTypeCall);
        Assert(info.Flags & CallFlags_Value);
        JavascriptFunction* caller = JavascriptCallStackLayout::FromFramePointer(framePtr)->functionObject;

        FunctionBody* functionBody = caller->GetFunctionBody();
        DynamicProfileInfo * dynamicProfileInfo = functionBody->GetDynamicProfileInfo();
        dynamicProfileInfo->RecordReturnType(functionBody, profileId, retval);
        JIT_HELPER_END(SimpleProfileReturnTypeCall);
    }